

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# enc.c
# Opt level: O3

char * encode_uint32(uint32_t i,char *p)

{
  *(uint32_t *)p = i;
  return p + 4;
}

Assistant:

char *encode_uint32(uint32_t i, char *p) {
    if (is_little_endian()) {
        *(uint32_t *) p = i;
    } else {
        // convert to little endian.
        big_endian_to_little(i, p);
    }
    return p + 4;
}